

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O2

Pass * wasm::createOptimizeCastsPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x130);
  memset(this,0,0x130);
  OptimizeCasts::OptimizeCasts((OptimizeCasts *)this);
  return this;
}

Assistant:

Pass* createOptimizeCastsPass() { return new OptimizeCasts(); }